

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall google::protobuf::internal::DynamicMapField::Clear(DynamicMapField *this)

{
  RepeatedPtrFieldBase *this_00;
  iterator iter;
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_30;
  
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            ((iterator *)&local_30,&this->map_);
  while (local_30.node_ != (Node *)0x0) {
    MapValueRef::DeleteData(&(((local_30.node_)->kv).v_)->second);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::operator++(&local_30);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(&this->map_);
  this_00 = &((this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase;
  if (this_00 != (RepeatedPtrFieldBase *)0x0) {
    RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>(this_00);
  }
  (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
  super_MapFieldBase.state_._M_i = STATE_MODIFIED_MAP;
  return;
}

Assistant:

void DynamicMapField::Clear() {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
       iter != map->end(); ++iter) {
    iter->second.DeleteData();
  }
  map->clear();

  if (MapFieldBase::repeated_field_ != nullptr) {
    MapFieldBase::repeated_field_->Clear();
  }
  // Data in map and repeated field are both empty, but we can't set status
  // CLEAN which will invalidate previous reference to map.
  MapFieldBase::SetMapDirty();
}